

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

Reader __thiscall
capnp::_::PointerReader::getBlob<capnp::Text>
          (PointerReader *this,void *defaultValue,ByteCount defaultSize)

{
  StringPtr SVar1;
  WirePointer *local_48;
  WirePointer *ref;
  ByteCount defaultSize_local;
  void *defaultValue_local;
  PointerReader *this_local;
  
  if (this->pointer == (WirePointer *)0x0) {
    local_48 = (WirePointer *)&(anonymous_namespace)::zero;
  }
  else {
    local_48 = this->pointer;
  }
  SVar1.content =
       (ArrayPtr<const_char>)
       WireHelpers::readTextPointer(this->segment,local_48,defaultValue,defaultSize);
  return (StringPtr)(StringPtr)SVar1.content;
}

Assistant:

Text::Reader PointerReader::getBlob<Text>(const void* defaultValue, ByteCount defaultSize) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readTextPointer(segment, ref, defaultValue, defaultSize);
}